

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fullsearch.cpp
# Opt level: O1

Position __thiscall FullSearch::getNextAction(FullSearch *this,Board *board)

{
  Position *pPVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Position *pPVar5;
  Position bestChoose;
  vector<Position,_std::allocator<Position>_> possibleChoose;
  Board tmpBoard;
  Position local_a8;
  vector<Position,_std::allocator<Position>_> local_a0;
  Board local_88;
  
  Board::Board(&local_88,board);
  Board::findPossibleChoose(&local_a0,&local_88);
  Position::Position(&local_a8);
  if (local_a0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_a0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar4 = -0x80000000;
    pPVar1 = local_a0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      pPVar5 = pPVar1 + 1;
      Board::operator=(&local_88,board);
      Board::doChoose(&local_88,*pPVar1);
      iVar2 = search(this,&local_88);
      iVar3 = -iVar2;
      if (2 < iVar2 + 1U) {
        iVar3 = iVar2;
      }
      if (local_88.nowPlayer == board->nowPlayer) {
        iVar3 = iVar2;
      }
      if (iVar4 < iVar3) {
        local_a8 = *pPVar1;
        iVar4 = iVar3;
      }
    } while ((iVar4 != 1) &&
            (pPVar1 = pPVar5,
            pPVar5 != local_a0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                      super__Vector_impl_data._M_finish));
  }
  if (local_a0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
      super__Vector_impl_data._M_start != (Position *)0x0) {
    operator_delete(local_a0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_a8;
}

Assistant:

Position FullSearch::getNextAction(const Board &board) {
    Board tmpBoard = board;
    vector<Position> possibleChoose = tmpBoard.findPossibleChoose();
    Position bestChoose;
    int bestValue = INT_MIN;
    for (const Position &choose : possibleChoose) {
        tmpBoard = board;
        tmpBoard.doChoose(choose);
        int value = search(tmpBoard);

        if (tmpBoard.nowPlayer != board.nowPlayer) {
            switch (value) {
                case WIN:
                    value = LOST;
                    break;
                case LOST:
                    value = WIN;
                    break;
                case TIE:
                    value = TIE;
                    break;
            }
        }
        if (value > bestValue) {
            bestValue = value;
            bestChoose = choose;
        }

        //fprintf(stderr, "value = %d\n", value);
        if (bestValue == WIN) {
            //fprintf(stderr, "%s think he will win\n", board.nowPlayer == Board::BLACK ? "black" : "white");
            break;
        }
    }

    if (bestValue == LOST) {
        //fprintf(stderr, "%s think he will lose\n", board.nowPlayer == Board::BLACK ? "black" : "white");
    }

    return bestChoose;
}